

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O1

void __thiscall Amiga::Chipset::update_interrupts(Chipset *this)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  
  Audio::set_interrupt_requests(&this->audio_,this->interrupt_requests_);
  this->interrupt_level_ = 0;
  uVar1._0_2_ = this->interrupt_enable_;
  uVar1._2_2_ = this->interrupt_requests_;
  uVar2 = this->interrupt_requests_ & (undefined2)uVar1;
  uVar3 = uVar2 & 0x3fff;
  if ((uVar1 >> 0xe & 1) != 0 && uVar3 != 0) {
    iVar4 = 6;
    if ((((0x1fff < uVar3) || (iVar4 = 5, 0x7ff < uVar3)) || (iVar4 = 4, 0x7f < uVar3)) ||
       (((iVar4 = 3, 0xf < uVar3 || (iVar4 = 2, 7 < uVar3)) || (iVar4 = 1, (uVar2 & 7) != 0)))) {
      this->interrupt_level_ = iVar4;
    }
  }
  return;
}

Assistant:

void Chipset::update_interrupts() {
	audio_.set_interrupt_requests(interrupt_requests_);
	interrupt_level_ = 0;

	const uint16_t enabled_requests = interrupt_enable_ & interrupt_requests_ & 0x3fff;
	if(enabled_requests && (interrupt_enable_ & 0x4000)) {
		if(enabled_requests & InterruptFlag::External) {
			interrupt_level_ = 6;
		} else if(enabled_requests & (InterruptFlag::SerialPortReceive | InterruptFlag::DiskSyncMatch)) {
			interrupt_level_ = 5;
		} else if(enabled_requests & (InterruptFlag::AudioChannel0 | InterruptFlag::AudioChannel1 | InterruptFlag::AudioChannel2 | InterruptFlag::AudioChannel3)) {
			interrupt_level_ = 4;
		} else if(enabled_requests & (InterruptFlag::Copper | InterruptFlag::VerticalBlank | InterruptFlag::Blitter)) {
			interrupt_level_ = 3;
		} else if(enabled_requests & InterruptFlag::IOPortsAndTimers) {
			interrupt_level_ = 2;
		} else if(enabled_requests & (InterruptFlag::SerialPortTransmit | InterruptFlag::DiskBlock | InterruptFlag::Software)) {
			interrupt_level_ = 1;
		}
	}
}